

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__encode_uint8_srgb4_linearalpha_ABGR
               (void *outputp,int width_times_channels,float *encode)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 (*pauVar9) [16];
  char cVar10;
  char *pcVar11;
  undefined1 (*pauVar12) [16];
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar30;
  short sVar31;
  short sVar32;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  short sVar41;
  short sVar42;
  short sVar43;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  short sVar44;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  
  auVar8 = _DAT_00619ac0;
  auVar7 = _DAT_00619a30;
  auVar6 = _DAT_00619a20;
  auVar5 = _DAT_00619a10;
  auVar4 = _DAT_00619a00;
  pcVar3 = (char *)((long)outputp + (long)width_times_channels);
  if (width_times_channels < 0x10) {
    do {
      fVar13 = *encode;
      if (fVar13 <= 0.00012207031) {
        cVar10 = '\0';
      }
      else {
        cVar10 = -1;
        if (fVar13 <= 0.99999994) {
          cVar10 = (char)(((uint)fVar13 >> 0xc & 0xff) *
                          (fp32_to_srgb8_tab4[(int)fVar13 + 0xc7000000U >> 0x14] & 0xffff) +
                          (fp32_to_srgb8_tab4[(int)fVar13 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00) >>
                         0x10);
        }
      }
      *(char *)((long)outputp + 3) = cVar10;
      fVar13 = encode[1];
      if (fVar13 <= 0.00012207031) {
        cVar10 = '\0';
      }
      else {
        cVar10 = -1;
        if (fVar13 <= 0.99999994) {
          cVar10 = (char)(((uint)fVar13 >> 0xc & 0xff) *
                          (fp32_to_srgb8_tab4[(int)fVar13 + 0xc7000000U >> 0x14] & 0xffff) +
                          (fp32_to_srgb8_tab4[(int)fVar13 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00) >>
                         0x10);
        }
      }
      *(char *)((long)outputp + 2) = cVar10;
      fVar13 = encode[2];
      if (fVar13 <= 0.00012207031) {
        cVar10 = '\0';
      }
      else {
        cVar10 = -1;
        if (fVar13 <= 0.99999994) {
          cVar10 = (char)(((uint)fVar13 >> 0xc & 0xff) *
                          (fp32_to_srgb8_tab4[(int)fVar13 + 0xc7000000U >> 0x14] & 0xffff) +
                          (fp32_to_srgb8_tab4[(int)fVar13 + 0xc7000000U >> 0x14] >> 7 & 0xfffe00) >>
                         0x10);
        }
      }
      *(char *)((long)outputp + 1) = cVar10;
      fVar14 = encode[3] * 255.0 + 0.5;
      fVar13 = 0.0;
      if (0.0 <= fVar14) {
        fVar13 = fVar14;
      }
      fVar14 = 255.0;
      if (fVar13 <= 255.0) {
        fVar14 = fVar13;
      }
      *(char *)outputp = (char)(int)fVar14;
      outputp = (void *)((long)outputp + 4);
      encode = encode + 4;
    } while (outputp < pcVar3);
  }
  else {
    pcVar1 = pcVar3 + -0x10;
    fVar13 = (float)DAT_00619ac0;
    fVar14 = DAT_00619ac0._4_4_;
    fVar15 = DAT_00619ac0._8_4_;
    fVar16 = DAT_00619ac0._12_4_;
    pauVar9 = (undefined1 (*) [16])encode;
    do {
      pcVar2 = (char *)((long)outputp + 0x10);
      pcVar11 = pcVar1;
      if (pcVar2 == pcVar3) {
        pcVar11 = pcVar2;
      }
      auVar39 = *pauVar9;
      pauVar12 = (undefined1 (*) [16])(encode + (long)width_times_channels + -0x10);
      if (pcVar2 == pcVar3) {
        pauVar12 = pauVar9 + 4;
      }
      if (pcVar2 <= pcVar1) {
        pcVar11 = pcVar2;
      }
      auVar28 = pauVar9[2];
      if (pcVar2 <= pcVar1) {
        pauVar12 = pauVar9 + 4;
      }
      auVar46._8_4_ = auVar39._4_4_;
      auVar46._0_8_ = auVar39._0_8_;
      auVar46._12_4_ = *(undefined4 *)(pauVar9[1] + 4);
      auVar33._4_4_ = *(undefined4 *)pauVar9[1];
      auVar33._0_4_ = auVar39._0_4_;
      auVar34._8_4_ = auVar28._4_4_;
      auVar34._0_8_ = auVar28._0_8_;
      auVar34._12_4_ = *(undefined4 *)(pauVar9[3] + 4);
      auVar27._8_8_ = auVar34._8_8_;
      auVar33._12_4_ = *(undefined4 *)pauVar9[3];
      auVar33._8_4_ = auVar28._0_4_;
      auVar26._4_4_ = *(undefined4 *)(pauVar9[1] + 8);
      auVar26._0_4_ = auVar39._8_4_;
      auVar26._12_4_ = *(undefined4 *)(pauVar9[3] + 8);
      auVar26._8_4_ = auVar28._8_4_;
      auVar27._0_8_ = auVar46._8_8_;
      auVar34 = maxps(auVar33,auVar4);
      auVar35 = minps(auVar34,auVar5);
      auVar34 = maxps(auVar27,auVar4);
      auVar34 = minps(auVar34,auVar5);
      auVar27 = maxps(auVar26,auVar4);
      auVar27 = minps(auVar27,auVar5);
      auVar38._0_4_ = auVar39._12_4_ * fVar13 + 0.5;
      auVar38._4_4_ = *(float *)(pauVar9[1] + 0xc) * fVar14 + 0.5;
      auVar38._8_4_ = auVar28._12_4_ * fVar15 + 0.5;
      auVar38._12_4_ = *(float *)(pauVar9[3] + 0xc) * fVar16 + 0.5;
      auVar39 = maxps(auVar38,ZEXT816(0));
      auVar39 = minps(auVar39,auVar8);
      auVar40._0_4_ = (int)auVar39._0_4_;
      auVar40._4_4_ = (int)auVar39._4_4_;
      auVar40._8_4_ = (int)auVar39._8_4_;
      auVar40._12_4_ = (int)auVar39._12_4_;
      auVar47._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar35._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar47._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar35._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar47._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar35._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar47._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar35._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar48._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar34._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar48._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar34._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar48._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar34._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar48._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar34._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar45._12_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar27._12_4_ >> 0x14) * 4 + 0x1c0)
      ;
      auVar45._8_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar27._8_4_ >> 0x14) * 4 + 0x1c0);
      auVar45._4_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar27._4_4_ >> 0x14) * 4 + 0x1c0);
      auVar45._0_4_ =
           *(undefined4 *)
            (SrgbTransform::SRGB_8BIT_TO_LINEAR_FLOAT + (ulong)(auVar27._0_4_ >> 0x14) * 4 + 0x1c0);
      auVar36._0_4_ = auVar35._0_4_ >> 0xc;
      auVar36._4_4_ = auVar35._4_4_ >> 0xc;
      auVar36._8_4_ = auVar35._8_4_ >> 0xc;
      auVar36._12_4_ = auVar35._12_4_ >> 0xc;
      auVar39 = pmaddwd(auVar36 & auVar6 | auVar7,auVar47);
      auVar37._0_4_ = auVar39._0_4_ >> 0x10;
      auVar37._4_4_ = auVar39._4_4_ >> 0x10;
      auVar37._8_4_ = auVar39._8_4_ >> 0x10;
      auVar37._12_4_ = auVar39._12_4_ >> 0x10;
      auVar39._0_4_ = auVar34._0_4_ >> 0xc;
      auVar39._4_4_ = auVar34._4_4_ >> 0xc;
      auVar39._8_4_ = auVar34._8_4_ >> 0xc;
      auVar39._12_4_ = auVar34._12_4_ >> 0xc;
      auVar39 = pmaddwd(auVar39 & auVar6 | auVar7,auVar48);
      auVar28._0_4_ = auVar39._0_4_ >> 0x10;
      auVar28._4_4_ = auVar39._4_4_ >> 0x10;
      auVar28._8_4_ = auVar39._8_4_ >> 0x10;
      auVar28._12_4_ = auVar39._12_4_ >> 0x10;
      auVar39 = packssdw(auVar28,auVar37);
      auVar35._0_4_ = auVar27._0_4_ >> 0xc;
      auVar35._4_4_ = auVar27._4_4_ >> 0xc;
      auVar35._8_4_ = auVar27._8_4_ >> 0xc;
      auVar35._12_4_ = auVar27._12_4_ >> 0xc;
      auVar28 = pmaddwd(auVar35 & auVar6 | auVar7,auVar45);
      auVar29._0_4_ = auVar28._0_4_ >> 0x10;
      auVar29._4_4_ = auVar28._4_4_ >> 0x10;
      auVar29._8_4_ = auVar28._8_4_ >> 0x10;
      auVar29._12_4_ = auVar28._12_4_ >> 0x10;
      auVar28 = packssdw(auVar40,auVar29);
      sVar20 = auVar39._6_2_;
      sVar32 = auVar28._6_2_;
      sVar19 = auVar39._4_2_;
      sVar31 = auVar28._4_2_;
      sVar18 = auVar39._2_2_;
      sVar30 = auVar28._2_2_;
      sVar17 = auVar39._0_2_;
      sVar25 = auVar28._0_2_;
      sVar41 = auVar28._8_2_;
      sVar21 = auVar39._8_2_;
      sVar42 = auVar28._10_2_;
      sVar22 = auVar39._10_2_;
      sVar43 = auVar28._12_2_;
      sVar23 = auVar39._12_2_;
      sVar44 = auVar28._14_2_;
      sVar24 = auVar39._14_2_;
      *(char *)outputp = (0 < sVar25) * (sVar25 < 0x100) * auVar28[0] - (0xff < sVar25);
      *(char *)((long)outputp + 1) = (0 < sVar41) * (sVar41 < 0x100) * auVar28[8] - (0xff < sVar41);
      *(char *)((long)outputp + 2) = (0 < sVar17) * (sVar17 < 0x100) * auVar39[0] - (0xff < sVar17);
      *(char *)((long)outputp + 3) = (0 < sVar21) * (sVar21 < 0x100) * auVar39[8] - (0xff < sVar21);
      *(char *)((long)outputp + 4) = (0 < sVar30) * (sVar30 < 0x100) * auVar28[2] - (0xff < sVar30);
      *(char *)((long)outputp + 5) = (0 < sVar42) * (sVar42 < 0x100) * auVar28[10] - (0xff < sVar42)
      ;
      *(char *)((long)outputp + 6) = (0 < sVar18) * (sVar18 < 0x100) * auVar39[2] - (0xff < sVar18);
      *(char *)((long)outputp + 7) = (0 < sVar22) * (sVar22 < 0x100) * auVar39[10] - (0xff < sVar22)
      ;
      *(char *)((long)outputp + 8) = (0 < sVar31) * (sVar31 < 0x100) * auVar28[4] - (0xff < sVar31);
      *(char *)((long)outputp + 9) =
           (0 < sVar43) * (sVar43 < 0x100) * auVar28[0xc] - (0xff < sVar43);
      *(char *)((long)outputp + 10) = (0 < sVar19) * (sVar19 < 0x100) * auVar39[4] - (0xff < sVar19)
      ;
      *(char *)((long)outputp + 0xb) =
           (0 < sVar23) * (sVar23 < 0x100) * auVar39[0xc] - (0xff < sVar23);
      *(char *)((long)outputp + 0xc) =
           (0 < sVar32) * (sVar32 < 0x100) * auVar28[6] - (0xff < sVar32);
      *(char *)((long)outputp + 0xd) =
           (0 < sVar44) * (sVar44 < 0x100) * auVar28[0xe] - (0xff < sVar44);
      *(char *)((long)outputp + 0xe) =
           (0 < sVar20) * (sVar20 < 0x100) * auVar39[6] - (0xff < sVar20);
      *(char *)((long)outputp + 0xf) =
           (0 < sVar24) * (sVar24 < 0x100) * auVar39[0xe] - (0xff < sVar24);
      pauVar9 = pauVar12;
      outputp = pcVar11;
    } while (pcVar2 != pcVar3);
  }
  return;
}

Assistant:

static void STBIR__CODER_NAME( stbir__encode_uint8_srgb4_linearalpha )( void * outputp, int width_times_channels, float const * encode )
{
  unsigned char STBIR_SIMD_STREAMOUT_PTR( * ) output = (unsigned char*) outputp;
  unsigned char * end_output = ( (unsigned char*) output ) + width_times_channels;

  #ifdef STBIR_SIMD

  if ( width_times_channels >= 16 )
  {
    float const * end_encode_m16 = encode + width_times_channels - 16;
    end_output -= 16;
    STBIR_SIMD_NO_UNROLL_LOOP_START_INF_FOR
    for(;;)
    {
      stbir__simdf f0, f1, f2, f3;
      stbir__simdi i0, i1, i2, i3;

      STBIR_SIMD_NO_UNROLL(encode);
      stbir__simdf_load4_transposed( f0, f1, f2, f3, encode );

      stbir__min_max_shift20( i0, f0 );
      stbir__min_max_shift20( i1, f1 );
      stbir__min_max_shift20( i2, f2 );
      stbir__scale_and_convert( i3, f3 );

      stbir__simdi_table_lookup3( i0, i1, i2, ( fp32_to_srgb8_tab4 - (127-13)*8 ) );

      stbir__linear_to_srgb_finish( i0, f0 );
      stbir__linear_to_srgb_finish( i1, f1 );
      stbir__linear_to_srgb_finish( i2, f2 );

      stbir__interleave_pack_and_store_16_u8( output,  STBIR_strs_join1(i, ,stbir__encode_order0), STBIR_strs_join1(i, ,stbir__encode_order1), STBIR_strs_join1(i, ,stbir__encode_order2), STBIR_strs_join1(i, ,stbir__encode_order3) );

      output += 16;
      encode += 16;

      if ( output <= end_output )
        continue;
      if ( output == ( end_output + 16 ) )
        break;
      output = end_output; // backup and do last couple
      encode = end_encode_m16;
    }
    return;
  }
  #endif

  STBIR_SIMD_NO_UNROLL_LOOP_START
  do {
    float f;
    STBIR_SIMD_NO_UNROLL(encode);

    output[stbir__decode_order0] = stbir__linear_to_srgb_uchar( encode[0] );
    output[stbir__decode_order1] = stbir__linear_to_srgb_uchar( encode[1] );
    output[stbir__decode_order2] = stbir__linear_to_srgb_uchar( encode[2] );

    f = encode[3] * stbir__max_uint8_as_float + 0.5f;
    STBIR_CLAMP(f, 0, 255);
    output[stbir__decode_order3] = (unsigned char) f;

    output += 4;
    encode += 4;
  } while( output < end_output );
}